

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes_encoder.h
# Opt level: O0

bool __thiscall
draco::AttributesEncoder::EncodeAttributes(AttributesEncoder *this,EncoderBuffer *out_buffer)

{
  ulong uVar1;
  undefined8 in_RSI;
  long *in_RDI;
  undefined1 local_1;
  
  uVar1 = (**(code **)(*in_RDI + 0x50))();
  if ((uVar1 & 1) == 0) {
    local_1 = false;
  }
  else {
    uVar1 = (**(code **)(*in_RDI + 0x58))(in_RDI,in_RSI);
    if ((uVar1 & 1) == 0) {
      local_1 = false;
    }
    else {
      uVar1 = (**(code **)(*in_RDI + 0x60))(in_RDI,in_RSI);
      if ((uVar1 & 1) == 0) {
        local_1 = false;
      }
      else {
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

virtual bool EncodeAttributes(EncoderBuffer *out_buffer) {
    if (!TransformAttributesToPortableFormat()) {
      return false;
    }
    if (!EncodePortableAttributes(out_buffer)) {
      return false;
    }
    // Encode data needed by portable transforms after the attribute is encoded.
    // This corresponds to the order in which the data is going to be decoded by
    // the decoder.
    if (!EncodeDataNeededByPortableTransforms(out_buffer)) {
      return false;
    }
    return true;
  }